

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O2

Top_dimensional_cells_iterator * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::Top_dimensional_cells_iterator::
operator++(Top_dimensional_cells_iterator *__return_storage_ptr__,
          Top_dimensional_cells_iterator *this)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  
  puVar1 = (this->counter).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (this->b->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    if (((ulong)((long)(this->b->sizes).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar2) >> 2 & 0xffffffff) == uVar3
       ) {
      *puVar1 = *puVar1 + 1;
LAB_00104bd3:
      Top_dimensional_cells_iterator(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (puVar1[uVar3] != (ulong)(puVar2[uVar3] - 1)) {
      puVar1[uVar3] = puVar1[uVar3] + 1;
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        puVar1[uVar4] = 0;
      }
      goto LAB_00104bd3;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

Top_dimensional_cells_iterator operator++() {
      // first find first element of the counter that can be increased:
      std::size_t dim = 0;
      while ((dim != this->b->dimension()) && (this->counter[dim] == this->b->sizes[dim] - 1)) ++dim;

      if (dim != this->b->dimension()) {
        ++this->counter[dim];
        for (std::size_t i = 0; i != dim; ++i) {
          this->counter[i] = 0;
        }
      } else {
        ++this->counter[0];
      }
      return *this;
    }